

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_4x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  ulong *puVar1;
  int *piVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  code *pcVar9;
  uint uVar10;
  undefined8 uVar11;
  int8_t *piVar12;
  bool bVar13;
  long lVar14;
  undefined7 in_register_00000009;
  int iVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  __m128i *cur_in;
  undefined1 (*pauVar19) [16];
  __m128i round;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  piVar12 = av1_fwd_txfm_shift_ls[5];
  uVar10 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar13 = true;
  if (uVar10 < 0x10) {
    if ((0x4110U >> (uVar10 & 0x1f) & 1) != 0) {
LAB_00428067:
      local_48 = (int)*av1_fwd_txfm_shift_ls[5];
      puVar1 = (ulong *)(input + stride * 4);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 3) * 2);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)puVar1 + (long)(stride * 2) * 2);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)((long)puVar1 + (long)stride * 2);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *puVar1;
      if (!bVar13) {
        auVar25 = pshuflw(auVar25,auVar25,0x1b);
        auVar33 = pshuflw(auVar33,auVar33,0x1b);
        auVar35 = pshuflw(auVar35,auVar35,0x1b);
        auVar21 = pshuflw(auVar21,auVar21,0x1b);
      }
      auVar25 = pmovsxwd(auVar25,auVar25);
      auVar33 = pmovsxwd(auVar33,auVar33);
      auVar35 = pmovsxwd(auVar35,auVar35);
      local_b8 = auVar25._0_4_ << local_48;
      iStack_b4 = auVar25._4_4_;
      iStack_b0 = auVar25._8_4_;
      iStack_ac = auVar25._12_4_;
      auVar21 = pmovsxwd(auVar21,auVar21);
      local_a8 = auVar33._0_4_ << local_48;
      iStack_a4 = auVar33._4_4_;
      iStack_a0 = auVar33._8_4_;
      iStack_9c = auVar33._12_4_;
      local_98 = auVar35._0_4_ << local_48;
      iStack_94 = auVar35._4_4_;
      iStack_90 = auVar35._8_4_;
      iStack_8c = auVar35._12_4_;
      local_88 = auVar21._0_4_ << local_48;
      iStack_84 = auVar21._4_4_;
      iStack_80 = auVar21._8_4_;
      iStack_7c = auVar21._12_4_;
      uVar4 = *(ulong *)(input + stride * 3);
      uVar5 = *(ulong *)(input + stride * 2);
      uVar6 = *(ulong *)(input + stride);
      uVar7 = *(ulong *)input;
      goto LAB_0042810c;
    }
    if ((0x80a0U >> (uVar10 & 0x1f) & 1) == 0) {
      if (uVar10 == 6) {
        bVar13 = false;
        goto LAB_00428067;
      }
    }
    else {
      bVar13 = false;
    }
  }
  local_48 = (int)*av1_fwd_txfm_shift_ls[5];
  puVar1 = (ulong *)(input + stride * 4);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)input;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(input + stride);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(input + stride * 2);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(input + stride * 3);
  if (!bVar13) {
    auVar20 = pshuflw(auVar20,auVar20,0x1b);
    auVar24 = pshuflw(auVar24,auVar24,0x1b);
    auVar32 = pshuflw(auVar32,auVar32,0x1b);
    auVar28 = pshuflw(auVar28,auVar28,0x1b);
  }
  auVar21 = pmovsxwd(auVar20,auVar20);
  auVar25 = pmovsxwd(auVar24,auVar24);
  auVar33 = pmovsxwd(auVar32,auVar32);
  local_b8 = auVar21._0_4_ << local_48;
  iStack_b4 = auVar21._4_4_;
  iStack_b0 = auVar21._8_4_;
  iStack_ac = auVar21._12_4_;
  auVar21 = pmovsxwd(auVar28,auVar28);
  local_a8 = auVar25._0_4_ << local_48;
  iStack_a4 = auVar25._4_4_;
  iStack_a0 = auVar25._8_4_;
  iStack_9c = auVar25._12_4_;
  local_98 = auVar33._0_4_ << local_48;
  iStack_94 = auVar33._4_4_;
  iStack_90 = auVar33._8_4_;
  iStack_8c = auVar33._12_4_;
  local_88 = auVar21._0_4_ << local_48;
  iStack_84 = auVar21._4_4_;
  iStack_80 = auVar21._8_4_;
  iStack_7c = auVar21._12_4_;
  uVar4 = *puVar1;
  uVar5 = *(ulong *)((long)puVar1 + (long)stride * 2);
  uVar6 = *(ulong *)((long)puVar1 + (long)(stride * 2) * 2);
  uVar7 = *(ulong *)((long)puVar1 + (long)(stride * 3) * 2);
LAB_0042810c:
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar7;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar6;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar5;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  if (!bVar13) {
    auVar22 = pshuflw(auVar22,auVar22,0x1b);
    auVar26 = pshuflw(auVar26,auVar26,0x1b);
    auVar29 = pshuflw(auVar29,auVar29,0x1b);
    auVar34 = pshuflw(auVar34,auVar34,0x1b);
  }
  pcVar9 = *(code **)((long)row_highbd_txfm4x4_arr + (ulong)(uVar10 * 8));
  auVar21 = pmovsxwd(auVar22,auVar22);
  auVar25 = pmovsxwd(auVar26,auVar26);
  auVar33 = pmovsxwd(auVar29,auVar29);
  auVar35 = pmovsxwd(auVar34,auVar34);
  local_78 = auVar21._0_4_ << local_48;
  iStack_74 = auVar21._4_4_;
  iStack_70 = auVar21._8_4_;
  iStack_6c = auVar21._12_4_;
  local_68 = auVar25._0_4_ << local_48;
  iStack_64 = auVar25._4_4_;
  iStack_60 = auVar25._8_4_;
  iStack_5c = auVar25._12_4_;
  local_58 = auVar33._0_4_ << local_48;
  iStack_54 = auVar33._4_4_;
  iStack_50 = auVar33._8_4_;
  iStack_4c = auVar33._12_4_;
  local_48 = auVar35._0_4_ << local_48;
  iStack_44 = auVar35._4_4_;
  iStack_40 = auVar35._8_4_;
  iStack_3c = auVar35._12_4_;
  pauVar19 = (undefined1 (*) [16])&local_b8;
  (**(code **)((long)col_highbd_txfm4x8_arr + (ulong)(uVar10 * 8)))(pauVar19,pauVar19,0xd,1);
  bVar8 = piVar12[1];
  iVar17 = 1 << (~bVar8 & 0x1f);
  auVar21 = ZEXT416((uint)-(int)(char)bVar8);
  local_b8 = local_b8 + iVar17 >> auVar21;
  iStack_b4 = iStack_b4 + iVar17 >> auVar21;
  iStack_b0 = iStack_b0 + iVar17 >> auVar21;
  iStack_ac = iStack_ac + iVar17 >> auVar21;
  local_a8 = local_a8 + iVar17 >> auVar21;
  iStack_a4 = iStack_a4 + iVar17 >> auVar21;
  iStack_a0 = iStack_a0 + iVar17 >> auVar21;
  iStack_9c = iStack_9c + iVar17 >> auVar21;
  local_98 = local_98 + iVar17 >> auVar21;
  iStack_94 = iStack_94 + iVar17 >> auVar21;
  iStack_90 = iStack_90 + iVar17 >> auVar21;
  iStack_8c = iStack_8c + iVar17 >> auVar21;
  local_88 = local_88 + iVar17 >> auVar21;
  iStack_84 = iStack_84 + iVar17 >> auVar21;
  iStack_80 = iStack_80 + iVar17 >> auVar21;
  iStack_7c = iStack_7c + iVar17 >> auVar21;
  local_78 = local_78 + iVar17 >> auVar21;
  iStack_74 = iStack_74 + iVar17 >> auVar21;
  iStack_70 = iStack_70 + iVar17 >> auVar21;
  iStack_6c = iStack_6c + iVar17 >> auVar21;
  local_68 = local_68 + iVar17 >> auVar21;
  iStack_64 = iStack_64 + iVar17 >> auVar21;
  iStack_60 = iStack_60 + iVar17 >> auVar21;
  iStack_5c = iStack_5c + iVar17 >> auVar21;
  local_58 = local_58 + iVar17 >> auVar21;
  iStack_54 = iStack_54 + iVar17 >> auVar21;
  iStack_50 = iStack_50 + iVar17 >> auVar21;
  iStack_4c = iStack_4c + iVar17 >> auVar21;
  local_48 = iVar17 + local_48 >> auVar21;
  iStack_44 = iVar17 + iStack_44 >> auVar21;
  iStack_40 = iVar17 + iStack_40 >> auVar21;
  iStack_3c = iVar17 + iStack_3c >> auVar21;
  lVar18 = 0;
  bVar13 = true;
  do {
    bVar16 = bVar13;
    auVar21 = *pauVar19;
    auVar25 = pauVar19[2];
    auVar33 = pauVar19[3];
    auVar36._0_8_ = auVar21._0_8_;
    auVar36._8_4_ = auVar21._4_4_;
    auVar36._12_4_ = *(undefined4 *)(pauVar19[1] + 4);
    auVar38._0_8_ = auVar25._0_8_;
    auVar38._8_4_ = auVar25._4_4_;
    auVar38._12_4_ = auVar33._4_4_;
    auVar23._0_8_ = CONCAT44(*(undefined4 *)(pauVar19[1] + 8),auVar21._8_4_);
    auVar23._8_4_ = auVar21._12_4_;
    auVar23._12_4_ = *(undefined4 *)(pauVar19[1] + 0xc);
    auVar30._0_8_ = CONCAT44(auVar33._8_4_,auVar25._8_4_);
    auVar30._8_4_ = auVar25._12_4_;
    auVar30._12_4_ = auVar33._12_4_;
    *(ulong *)*pauVar19 = CONCAT44(*(undefined4 *)pauVar19[1],auVar21._0_4_);
    *(ulong *)(*pauVar19 + 8) = CONCAT44(auVar33._0_4_,auVar25._0_4_);
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._0_8_ = auVar36._8_8_;
    pauVar19[1] = auVar37;
    *(undefined8 *)pauVar19[2] = auVar23._0_8_;
    *(undefined8 *)(pauVar19[2] + 8) = auVar30._0_8_;
    *(long *)pauVar19[3] = auVar23._8_8_;
    *(long *)(pauVar19[3] + 8) = auVar30._8_8_;
    (*pcVar9)(pauVar19,pauVar19,0xd,1);
    bVar8 = piVar12[2];
    iVar17 = (int)(char)bVar8;
    if (iVar17 < 0) {
      iVar15 = 1 << (~bVar8 & 0x1f);
      auVar21 = ZEXT416((uint)-iVar17);
      lVar14 = 0;
      auVar25 = pmovsxwd(auVar33,0x16a116a116a116a1);
      auVar33 = pmovsxwd(auVar37,0x800080008000800);
      do {
        piVar2 = (int *)(*pauVar19 + lVar14);
        auVar31._0_4_ = *piVar2 + iVar15 >> auVar21;
        auVar31._4_4_ = piVar2[1] + iVar15 >> auVar21;
        auVar31._8_4_ = piVar2[2] + iVar15 >> auVar21;
        auVar31._12_4_ = piVar2[3] + iVar15 >> auVar21;
        auVar35 = pmulld(auVar31,auVar25);
        piVar2 = (int *)(*pauVar19 + lVar14);
        *piVar2 = auVar35._0_4_ + auVar33._0_4_ >> 0xc;
        piVar2[1] = auVar35._4_4_ + auVar33._4_4_ >> 0xc;
        piVar2[2] = auVar35._8_4_ + auVar33._8_4_ >> 0xc;
        piVar2[3] = auVar35._12_4_ + auVar33._12_4_ >> 0xc;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
    }
    else {
      lVar14 = 0;
      auVar21 = pmovsxwd(auVar30,0x16a116a116a116a1);
      auVar25 = pmovsxwd(auVar33,0x800080008000800);
      do {
        piVar2 = (int *)(*pauVar19 + lVar14);
        auVar27._0_4_ = *piVar2 << iVar17;
        auVar27._4_4_ = piVar2[1];
        auVar27._8_4_ = piVar2[2];
        auVar27._12_4_ = piVar2[3];
        auVar33 = pmulld(auVar27,auVar21);
        piVar2 = (int *)(*pauVar19 + lVar14);
        *piVar2 = auVar33._0_4_ + auVar25._0_4_ >> 0xc;
        piVar2[1] = auVar33._4_4_ + auVar25._4_4_ >> 0xc;
        piVar2[2] = auVar33._8_4_ + auVar25._8_4_ >> 0xc;
        piVar2[3] = auVar33._12_4_ + auVar25._12_4_ >> 0xc;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
    }
    lVar14 = 0;
    do {
      uVar11 = *(undefined8 *)((long)(*pauVar19 + lVar14) + 8);
      puVar3 = (undefined8 *)((long)coeff + lVar14 * 2 + lVar18 * 4);
      *puVar3 = *(undefined8 *)(*pauVar19 + lVar14);
      puVar3[1] = uVar11;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar18 = 4;
    pauVar19 = (undefined1 (*) [16])&local_78;
    bVar13 = false;
  } while (bVar16);
  return;
}

Assistant:

void av1_fwd_txfm2d_4x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X8];
  const int txw_idx = get_txw_idx(TX_4X8);
  const int txh_idx = get_txh_idx(TX_4X8);
  const int txfm_size_col = tx_size_wide[TX_4X8];
  const int txfm_size_row = tx_size_high[TX_4X8];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_4x8(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bitcol, 1);
  col_txfm_4x8_rounding(in, -shift[1]);

  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * 4];
    transpose_32bit_4x4(cur_in, cur_in);
    row_txfm(cur_in, cur_in, bitrow, 1);
    av1_round_shift_rect_array_32_sse4_1(cur_in, cur_in, txfm_size_col,
                                         -shift[2], NewSqrt2);
    store_output_w4(coeff + i * 4, cur_in, txfm_size_row, 4);
  }
  (void)bd;
}